

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_Test::
TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_Test
          (TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_Test *this)

{
  TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_Test *this_local;
  
  memset(this,0,0x18);
  TEST_GROUP_CppUTestGroupCommandLineArguments::TEST_GROUP_CppUTestGroupCommandLineArguments
            (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments);
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_Test_003c7c08;
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeStrictGroupFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xsggroup" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}